

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan
               (Scanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  ArrayInit *pAVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicWait *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  MemoryGrow *pMVar24;
  Name *currp_00;
  ulong uVar25;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar25 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case IfId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitIf,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pMVar8->size);
    goto LAB_007fc264;
  case LoopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoop,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_007fbddc;
  case BreakId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBreak,currp);
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pBVar18->condition);
    ppEVar17 = &pBVar18->value;
    goto LAB_007fbdb2;
  case SwitchId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSwitch,currp)
    ;
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    goto LAB_007fbdb2;
  case CallId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCall,currp);
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar25 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case CallIndirectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallIndirect,
               currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pCVar20->target);
    uVar25 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case LocalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalSet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_007fc0f8;
  case GlobalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalSet,
               currp);
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_007fbddc;
  case LoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoad,currp);
    pLVar11 = Expression::cast<wasm::Load>(this);
    ppEVar17 = &pLVar11->ptr;
    goto LAB_007fc2f2;
  case StoreId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_007fc0bf;
  case ConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnary,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_007fc0f8;
  case BinaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBinary,currp)
    ;
    pAVar9 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_007fc2cc;
  case SelectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSelect,currp)
    ;
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_007fbe3c;
  case DropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDrop,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::Drop>(this);
    break;
  case ReturnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitReturn,currp)
    ;
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    goto LAB_007fbdb2;
  case MemorySizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryGrow,
               currp);
    pMVar24 = Expression::cast<wasm::MemoryGrow>(this);
    break;
  case NopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_007fc176;
  case AtomicCmpxchgId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicCmpxchg
               ,currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_007fc159;
  case AtomicWaitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicWait,
               currp);
    pAVar9 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_007fbaf9;
  case AtomicNotifyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_007fc2cc;
  case AtomicFenceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_007fc0f8;
  case SIMDReplaceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = (Name *)&pAVar9->timeout;
    goto LAB_007fc2da;
  case SIMDShuffleId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_007fc264;
  case SIMDTernaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_007fbaf9;
  case SIMDShiftId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShift,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_007fc2cc;
  case SIMDLoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDLoad,
               currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_007fbf94;
  case SIMDLoadStoreLaneId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_007fc0bf:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pSVar22->value);
    ppEVar17 = &pSVar22->ptr;
    goto LAB_007fc2f2;
  case MemoryInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryInit,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_007fc159:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar6->replacement);
    goto LAB_007fc176;
  case DataDropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_007fbe3c;
  case MemoryFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_007fbe3c;
  case PopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefNull,currp
              );
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefIsNull,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefIsNull>(this);
    break;
  case RefFuncId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefFunc,currp
              );
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefEq,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_007fc264;
  case TableGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGet,
               currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_007fbddc:
    ppEVar17 = &pGVar5->value;
    goto LAB_007fc2f2;
  case TableSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSet,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_007fc176;
  case TableSizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGrow,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_007fc176:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar6->expected);
    ppEVar17 = &pAVar6->ptr;
    goto LAB_007fc2f2;
  case TryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTry,currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar25 = (ulong)(uint)(pTVar21->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar21->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    ppEVar17 = &pTVar21->body;
    goto LAB_007fc2f2;
  case ThrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar25 = (ulong)(uint)(pTVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar23->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case RethrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRethrow,currp
              );
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleMake,
               currp);
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar25 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case TupleExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleExtract,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::TupleExtract>(this);
    break;
  case I31NewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31New,currp)
    ;
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31New>(this);
    break;
  case I31GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31Get,currp)
    ;
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31Get>(this);
    break;
  case CallRefId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallRef,currp
              );
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pCVar12->target);
    uVar25 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case RefTestId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefTest,currp
              );
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefTest>(this);
    break;
  case RefCastId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefCast,currp
              );
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefCast>(this);
    break;
  case BrOnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBrOn,currp);
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_007fbf94:
    ppEVar17 = &pSVar4->ptr;
    goto LAB_007fc2f2;
  case StructNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructNew,
               currp);
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar25 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case StructGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructGet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_007fc0f8;
  case StructSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructSet,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_007fc2cc;
  case ArrayNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNew,
               currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar15->size);
    ppEVar17 = &pAVar15->init;
LAB_007fbdb2:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,ppEVar17
              );
    return;
  case ArrayNewSegId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewSeg,
               currp);
    pAVar3 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_007fbc81;
  case ArrayNewFixedId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewFixed
               ,currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar25 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar25) {
      uVar25 = uVar25 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar25);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                 ppEVar17);
    }
    return;
  case ArrayGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayGet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_007fc264;
  case ArraySetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArraySet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_007fbe3c;
  case ArrayLenId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayLen,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::ArrayLen>(this);
    break;
  case ArrayCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayCopy,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_007fbab2;
  case ArrayFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_007fbab2:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pMVar8->destMemory);
    goto LAB_007fbe3c;
  case ArrayInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInit,
               currp);
    pAVar3 = Expression::cast<wasm::ArrayInit>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar3->size);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar3->offset);
LAB_007fbc81:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar3->index);
    ppEVar17 = &pAVar3->ref;
    goto LAB_007fc2f2;
  case RefAsId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefAs,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_007fc0f8;
  case StringNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringNew,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar9->expectedType);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar9->timeout);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pAVar9->expected);
    goto LAB_007fc2e5;
  case StringConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringMeasure
               ,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_007fc0f8;
  case StringEncodeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEncode,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar9->timeout);
    goto LAB_007fbf3c;
  case StringConcatId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConcat,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_007fc264;
  case StringEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEq,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
    goto LAB_007fc2cc;
  case StringAsId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringAs,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_007fc0f8:
    ppEVar17 = &pSVar2->vec;
    goto LAB_007fc2f2;
  case StringWTF8AdvanceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF8Advance,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_007fbe3c:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pMVar8->size);
    goto LAB_007fc264;
  case StringWTF16GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF16Get,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_007fc264;
  case StringIterNextId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringIterNext,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::StringIterNext>(this);
    break;
  case StringIterMoveId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringIterMove,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringIterMove>(this);
LAB_007fc2cc:
    currp_00 = (Name *)&pAVar9->expected;
LAB_007fc2da:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)currp_00);
LAB_007fc2e5:
    ppEVar17 = &pAVar9->ptr;
    goto LAB_007fc2f2;
  case StringSliceWTFId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceWTF,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_007fbaf9:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pAVar9->timeout);
LAB_007fbf3c:
    currp_00 = (Name *)&pAVar9->expected;
    goto LAB_007fc2da;
  case StringSliceIterId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceIter,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_007fc264:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               &pMVar8->source);
    ppEVar17 = &pMVar8->dest;
    goto LAB_007fc2f2;
  default:
    return;
  }
  ppEVar17 = &pMVar24->delta;
LAB_007fc2f2:
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
            ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,ppEVar17);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }